

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::GetColumnsStringValue_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ParsedExpression *expr)

{
  pointer pcVar1;
  ColumnRefExpression *this_00;
  string *psVar2;
  
  if (this[8] == (duckdb)0xcb) {
    this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>((BaseExpression *)this);
    psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  }
  else {
    (**(code **)(*(long *)this + 0x40))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetColumnsStringValue(ParsedExpression &expr) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		return colref.GetColumnName();
	} else {
		return expr.ToString();
	}
}